

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

upb_Arena * upb_Arena_Init(void *mem,size_t n,upb_alloc *alloc)

{
  uintptr_t uVar1;
  upb_alloc *local_68;
  upb_alloc *local_50;
  upb_Arena *ret;
  size_t delta;
  void *aligned;
  upb_ArenaState *a;
  upb_alloc *alloc_local;
  size_t n_local;
  void *mem_local;
  
  alloc_local = (upb_alloc *)n;
  n_local = (size_t)mem;
  if (mem != (void *)0x0) {
    n_local = (long)mem + 7U & 0xfffffffffffffff8;
    if (n < n_local - (long)mem) {
      local_50 = (upb_alloc *)0x0;
    }
    else {
      local_50 = (upb_alloc *)(n - (n_local - (long)mem));
    }
    alloc_local = local_50;
  }
  if (alloc_local < (upb_alloc *)0x48 || n_local == 0) {
    if (n_local == 0) {
      local_68 = alloc_local;
    }
    else {
      local_68 = (upb_alloc *)0x0;
    }
    mem_local = _upb_Arena_InitSlow(alloc,(size_t)local_68);
  }
  else {
    uVar1 = _upb_Arena_TaggedFromRefcount(1);
    *(uintptr_t *)(n_local + 0x20) = uVar1;
    *(undefined8 *)(n_local + 0x28) = 0;
    uVar1 = _upb_Arena_TaggedFromTail((upb_ArenaInternal *)(n_local + 0x10));
    *(uintptr_t *)(n_local + 0x30) = uVar1;
    *(undefined8 *)(n_local + 0x40) = 0;
    *(undefined8 *)(n_local + 0x38) = 0;
    *(undefined8 *)(n_local + 0x18) = 0;
    uVar1 = _upb_Arena_MakeBlockAlloc(alloc,true);
    *(uintptr_t *)(n_local + 0x10) = uVar1;
    *(size_t *)n_local = n_local + 0x4f & 0xfffffffffffffff8;
    *(size_t *)(n_local + 8) = (long)&alloc_local->func + n_local;
    mem_local = (void *)n_local;
  }
  return (upb_Arena *)mem_local;
}

Assistant:

upb_Arena* upb_Arena_Init(void* mem, size_t n, upb_alloc* alloc) {
  UPB_ASSERT(sizeof(void*) * UPB_ARENA_SIZE_HACK >= sizeof(upb_ArenaState));
  upb_ArenaState* a;

  if (mem) {
    /* Align initial pointer up so that we return properly-aligned pointers. */
    void* aligned = (void*)UPB_ALIGN_MALLOC((uintptr_t)mem);
    size_t delta = (uintptr_t)aligned - (uintptr_t)mem;
    n = delta <= n ? n - delta : 0;
    mem = aligned;
  }
  if (UPB_UNLIKELY(n < sizeof(upb_ArenaState) || !mem)) {
    upb_Arena* ret = _upb_Arena_InitSlow(alloc, mem ? 0 : n);
#ifdef UPB_TRACING_ENABLED
    upb_Arena_LogInit(ret, n);
#endif
    return ret;
  }

  a = mem;

  upb_Atomic_Init(&a->body.parent_or_count, _upb_Arena_TaggedFromRefcount(1));
  upb_Atomic_Init(&a->body.next, NULL);
  upb_Atomic_Init(&a->body.previous_or_tail,
                  _upb_Arena_TaggedFromTail(&a->body));
  upb_Atomic_Init(&a->body.space_allocated, 0);
  a->body.blocks = NULL;
  a->body.upb_alloc_cleanup = NULL;
  a->body.block_alloc = _upb_Arena_MakeBlockAlloc(alloc, 1);
  a->head.UPB_PRIVATE(ptr) = (void*)UPB_ALIGN_MALLOC((uintptr_t)(a + 1));
  a->head.UPB_PRIVATE(end) = UPB_PTR_AT(mem, n, char);
  UPB_TSAN_INIT_PUBLISHED(&a->body);
#ifdef UPB_TRACING_ENABLED
  upb_Arena_LogInit(&a->head, n);
#endif
  return &a->head;
}